

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O2

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::D3D6::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,D3D6 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  MthdD3D56TlvFogCol1 *pMVar1;
  MthdD3D56TlvColor *pMVar2;
  MthdD3D56TlvRhw *pMVar3;
  MthdD3D56TlvZ *pMVar4;
  MthdD3D56TlvY *pMVar5;
  MthdD3D56TlvX *pMVar6;
  MthdD3D56FogColor *pMVar7;
  MthdD3D6StencilOp *pMVar8;
  MthdD3D6StencilFunc *pMVar9;
  MthdD3D56Config *pMVar10;
  MthdD3D56Blend *pMVar11;
  MthdD3D6CombineFactor *pMVar12;
  MthdD3D6CombineControl *pMVar13;
  MthdD3D56TexFilter *pMVar14;
  MthdD3D56TexFormat *pMVar15;
  MthdD3D56TexOffset *pMVar16;
  MthdCtxSurf3D *pMVar17;
  MthdDmaGrobj *pMVar18;
  MthdDmaNotify *pMVar19;
  MthdNotify *pMVar20;
  SingleMthdTest *pSVar21;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar22;
  result_type rVar23;
  MthdD3D56TlvUv *pMVar24;
  UntestedMthd *this_01;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_67a;
  allocator local_679;
  allocator local_678;
  allocator local_677;
  allocator local_676;
  allocator local_675;
  allocator local_674;
  allocator local_673;
  allocator local_672;
  allocator local_671;
  allocator local_670;
  allocator local_66f;
  allocator local_66e;
  allocator local_66d;
  allocator local_66c;
  allocator local_66b;
  allocator local_66a;
  allocator local_669;
  allocator local_668;
  allocator local_667;
  allocator local_666;
  allocator local_665;
  allocator local_664;
  allocator local_663;
  allocator local_662;
  allocator local_661;
  allocator local_660;
  allocator local_65f;
  allocator local_65e;
  allocator local_65d;
  allocator local_65c;
  allocator local_65b;
  allocator local_65a;
  allocator local_659;
  MthdD3D56TlvUv *local_658;
  MthdD3D56TlvUv *local_650;
  MthdD3D56TlvUv *local_648;
  MthdD3D56TlvFogCol1 *local_640;
  MthdD3D56TlvColor *local_638;
  MthdD3D56TlvRhw *local_630;
  MthdD3D56TlvZ *local_628;
  MthdD3D56TlvY *local_620;
  MthdD3D56TlvX *local_618;
  MthdD3D56FogColor *local_610;
  MthdD3D6StencilOp *local_608;
  MthdD3D6StencilFunc *local_600;
  MthdD3D56Config *local_5f8;
  MthdD3D56Blend *local_5f0;
  MthdD3D6CombineFactor *local_5e8;
  MthdD3D6CombineControl *local_5e0;
  MthdD3D6CombineControl *local_5d8;
  MthdD3D6CombineControl *local_5d0;
  MthdD3D6CombineControl *local_5c8;
  MthdD3D56TexFilter *local_5c0;
  MthdD3D56TexFilter *local_5b8;
  MthdD3D56TexFormat *local_5b0;
  MthdD3D56TexFormat *local_5a8;
  MthdD3D56TexOffset *local_5a0;
  MthdD3D56TexOffset *local_598;
  MthdCtxSurf3D *local_590;
  MthdDmaGrobj *local_588;
  MthdDmaGrobj *local_580;
  MthdDmaNotify *local_578;
  MthdNotify *local_570;
  SingleMthdTest *local_568;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_560;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  SingleMthdTest *local_138;
  MthdNotify *local_130;
  MthdDmaNotify *local_128;
  MthdDmaGrobj *local_120;
  MthdDmaGrobj *local_118;
  MthdCtxSurf3D *local_110;
  MthdD3D56TexOffset *local_108;
  MthdD3D56TexOffset *local_100;
  MthdD3D56TexFormat *local_f8;
  MthdD3D56TexFormat *local_f0;
  MthdD3D56TexFilter *local_e8;
  MthdD3D56TexFilter *local_e0;
  MthdD3D6CombineControl *local_d8;
  MthdD3D6CombineControl *local_d0;
  MthdD3D6CombineControl *local_c8;
  MthdD3D6CombineControl *local_c0;
  MthdD3D6CombineFactor *local_b8;
  MthdD3D56Blend *local_b0;
  MthdD3D56Config *local_a8;
  MthdD3D6StencilFunc *local_a0;
  MthdD3D6StencilOp *local_98;
  MthdD3D56FogColor *local_90;
  MthdD3D56TlvX *local_88;
  MthdD3D56TlvY *local_80;
  MthdD3D56TlvZ *local_78;
  MthdD3D56TlvRhw *local_70;
  MthdD3D56TlvColor *local_68;
  MthdD3D56TlvFogCol1 *local_60;
  MthdD3D56TlvUv *local_58;
  MthdD3D56TlvUv *local_50;
  MthdD3D56TlvUv *local_48;
  MthdD3D56TlvUv *local_40;
  UntestedMthd *local_38;
  
  local_560 = __return_storage_ptr__;
  local_568 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_158,"nop",&local_659);
  pSVar21 = local_568;
  opt = &(this->super_Class).opt;
  MthdNop::SingleMthdTest
            ((MthdNop *)local_568,opt,(uint32_t)rVar23,&local_158,-1,(this->super_Class).cls,0x100,1
             ,4);
  local_138 = pSVar21;
  local_570 = (MthdNotify *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_178,"notify",&local_65a);
  pMVar20 = local_570;
  MthdNotify::SingleMthdTest
            (local_570,opt,(uint32_t)rVar23,&local_178,-1,(this->super_Class).cls,0x104,1,4);
  local_130 = pMVar20;
  local_578 = (MthdDmaNotify *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_198,"dma_notify",&local_65b);
  pMVar19 = local_578;
  MthdDmaNotify::SingleMthdTest
            (local_578,opt,(uint32_t)rVar23,&local_198,-1,(this->super_Class).cls,0x180,1,4);
  local_128 = pMVar19;
  local_580 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1b8,"dma_tex_a",&local_65c);
  pMVar18 = local_580;
  MthdDmaGrobj::MthdDmaGrobj
            (local_580,opt,(uint32_t)rVar23,&local_1b8,-1,(this->super_Class).cls,0x184,0,4);
  local_120 = pMVar18;
  local_588 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1d8,"dma_tex_b",&local_65d);
  pMVar18 = local_588;
  MthdDmaGrobj::MthdDmaGrobj
            (local_588,opt,(uint32_t)rVar23,&local_1d8,-1,(this->super_Class).cls,0x188,1,4);
  local_118 = pMVar18;
  local_590 = (MthdCtxSurf3D *)operator_new(0x25958);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_1f8,"ctx_surf3d",&local_65e);
  pMVar17 = local_590;
  MthdCtxSurf3D::MthdCtxSurf3D
            (local_590,opt,(uint32_t)rVar23,&local_1f8,-1,(this->super_Class).cls,0x18c,0);
  local_110 = pMVar17;
  local_598 = (MthdD3D56TexOffset *)operator_new(0x25958);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_218,"tex_0_offset",&local_65f);
  pMVar16 = local_598;
  MthdD3D56TexOffset::MthdD3D56TexOffset
            (local_598,opt,(uint32_t)rVar23,&local_218,-1,(this->super_Class).cls,0x308,1);
  local_108 = pMVar16;
  local_5a0 = (MthdD3D56TexOffset *)operator_new(0x25958);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_238,"tex_1_offset",&local_660);
  pMVar16 = local_5a0;
  MthdD3D56TexOffset::MthdD3D56TexOffset
            (local_5a0,opt,(uint32_t)rVar23,&local_238,-1,(this->super_Class).cls,0x30c,2);
  local_100 = pMVar16;
  local_5a8 = (MthdD3D56TexFormat *)operator_new(0x25958);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_258,"tex_0_format",&local_661);
  pMVar15 = local_5a8;
  MthdD3D56TexFormat::MthdD3D56TexFormat
            (local_5a8,opt,(uint32_t)rVar23,&local_258,-1,(this->super_Class).cls,0x310,1);
  local_f8 = pMVar15;
  local_5b0 = (MthdD3D56TexFormat *)operator_new(0x25958);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_278,"tex_1_format",&local_662);
  pMVar15 = local_5b0;
  MthdD3D56TexFormat::MthdD3D56TexFormat
            (local_5b0,opt,(uint32_t)rVar23,&local_278,-1,(this->super_Class).cls,0x314,2);
  local_f0 = pMVar15;
  local_5b8 = (MthdD3D56TexFilter *)operator_new(0x25958);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_298,"tex_0_filter",&local_663);
  pMVar14 = local_5b8;
  MthdD3D56TexFilter::MthdD3D56TexFilter
            (local_5b8,opt,(uint32_t)rVar23,&local_298,-1,(this->super_Class).cls,0x318,1);
  local_e8 = pMVar14;
  local_5c0 = (MthdD3D56TexFilter *)operator_new(0x25958);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2b8,"tex_1_filter",&local_664);
  pMVar14 = local_5c0;
  MthdD3D56TexFilter::MthdD3D56TexFilter
            (local_5c0,opt,(uint32_t)rVar23,&local_2b8,-1,(this->super_Class).cls,0x31c,2);
  local_e0 = pMVar14;
  local_5c8 = (MthdD3D6CombineControl *)operator_new(0x25958);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2d8,"combine_0_control_alpha",&local_665);
  pMVar13 = local_5c8;
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (local_5c8,opt,(uint32_t)rVar23,&local_2d8,-1,(this->super_Class).cls,800,0,0);
  local_d8 = pMVar13;
  local_5d0 = (MthdD3D6CombineControl *)operator_new(0x25958);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_2f8,"combine_0_control_color",&local_666);
  pMVar13 = local_5d0;
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (local_5d0,opt,(uint32_t)rVar23,&local_2f8,-1,(this->super_Class).cls,0x324,0,1);
  local_d0 = pMVar13;
  local_5d8 = (MthdD3D6CombineControl *)operator_new(0x25958);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_318,"combine_1_control_alpha",&local_667);
  pMVar13 = local_5d8;
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (local_5d8,opt,(uint32_t)rVar23,&local_318,-1,(this->super_Class).cls,0x32c,1,0);
  local_c8 = pMVar13;
  local_5e0 = (MthdD3D6CombineControl *)operator_new(0x25958);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_338,"combine_1_control_color",&local_668);
  pMVar13 = local_5e0;
  MthdD3D6CombineControl::MthdD3D6CombineControl
            (local_5e0,opt,(uint32_t)rVar23,&local_338,-1,(this->super_Class).cls,0x330,1,1);
  local_c0 = pMVar13;
  local_5e8 = (MthdD3D6CombineFactor *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_358,"combine_factor",&local_669);
  pMVar12 = local_5e8;
  MthdD3D6CombineFactor::SingleMthdTest
            (local_5e8,opt,(uint32_t)rVar23,&local_358,-1,(this->super_Class).cls,0x334,1,4);
  local_b8 = pMVar12;
  local_5f0 = (MthdD3D56Blend *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_378,"blend",&local_66a);
  pMVar11 = local_5f0;
  MthdD3D56Blend::SingleMthdTest
            (local_5f0,opt,(uint32_t)rVar23,&local_378,-1,(this->super_Class).cls,0x338,1,4);
  local_b0 = pMVar11;
  local_5f8 = (MthdD3D56Config *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_398,"config",&local_66b);
  pMVar10 = local_5f8;
  MthdD3D56Config::SingleMthdTest
            (local_5f8,opt,(uint32_t)rVar23,&local_398,-1,(this->super_Class).cls,0x33c,1,4);
  local_a8 = pMVar10;
  local_600 = (MthdD3D6StencilFunc *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3b8,"stencil_func",&local_66c);
  pMVar9 = local_600;
  MthdD3D6StencilFunc::SingleMthdTest
            (local_600,opt,(uint32_t)rVar23,&local_3b8,-1,(this->super_Class).cls,0x340,1,4);
  local_a0 = pMVar9;
  local_608 = (MthdD3D6StencilOp *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3d8,"stencil_op",&local_66d);
  pMVar8 = local_608;
  MthdD3D6StencilOp::SingleMthdTest
            (local_608,opt,(uint32_t)rVar23,&local_3d8,-1,(this->super_Class).cls,0x344,1,4);
  local_98 = pMVar8;
  local_610 = (MthdD3D56FogColor *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_3f8,"fog_color",&local_66e);
  pMVar7 = local_610;
  MthdD3D56FogColor::SingleMthdTest
            (local_610,opt,(uint32_t)rVar23,&local_3f8,-1,(this->super_Class).cls,0x348,1,4);
  local_90 = pMVar7;
  local_618 = (MthdD3D56TlvX *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_418,"tlv_x",&local_66f);
  pMVar6 = local_618;
  MthdD3D56TlvX::SingleMthdTest
            (local_618,opt,(uint32_t)rVar23,&local_418,-1,(this->super_Class).cls,0x400,8,0x28);
  local_88 = pMVar6;
  local_620 = (MthdD3D56TlvY *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_438,"tlv_y",&local_670);
  pMVar5 = local_620;
  MthdD3D56TlvY::SingleMthdTest
            (local_620,opt,(uint32_t)rVar23,&local_438,-1,(this->super_Class).cls,0x404,8,0x28);
  local_80 = pMVar5;
  local_628 = (MthdD3D56TlvZ *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_458,"tlv_z",&local_671);
  pMVar4 = local_628;
  MthdD3D56TlvZ::SingleMthdTest
            (local_628,opt,(uint32_t)rVar23,&local_458,-1,(this->super_Class).cls,0x408,8,0x28);
  local_78 = pMVar4;
  local_630 = (MthdD3D56TlvRhw *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_478,"tlv_rhw",&local_672);
  pMVar3 = local_630;
  MthdD3D56TlvRhw::SingleMthdTest
            (local_630,opt,(uint32_t)rVar23,&local_478,-1,(this->super_Class).cls,0x40c,8,0x28);
  local_70 = pMVar3;
  local_638 = (MthdD3D56TlvColor *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_498,"tlv_color",&local_673);
  pMVar2 = local_638;
  MthdD3D56TlvColor::SingleMthdTest
            (local_638,opt,(uint32_t)rVar23,&local_498,-1,(this->super_Class).cls,0x410,8,0x28);
  local_68 = pMVar2;
  local_640 = (MthdD3D56TlvFogCol1 *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_4b8,"tlv_fog_col1",&local_674);
  pMVar1 = local_640;
  MthdD3D56TlvFogCol1::SingleMthdTest
            (local_640,opt,(uint32_t)rVar23,&local_4b8,-1,(this->super_Class).cls,0x414,8,0x28);
  local_60 = pMVar1;
  local_648 = (MthdD3D56TlvUv *)operator_new(0x25960);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_4d8,"tlv_u_0",&local_675);
  pMVar24 = local_648;
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (local_648,opt,(uint32_t)rVar23,&local_4d8,-1,(this->super_Class).cls,0x418,8,0x28,0,0,
             false);
  local_58 = pMVar24;
  local_650 = (MthdD3D56TlvUv *)operator_new(0x25960);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_4f8,"tlv_v_0",&local_676);
  pMVar24 = local_650;
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (local_650,opt,(uint32_t)rVar23,&local_4f8,-1,(this->super_Class).cls,0x41c,8,0x28,0,1,
             false);
  local_50 = pMVar24;
  local_658 = (MthdD3D56TlvUv *)operator_new(0x25960);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_518,"tlv_u_1",&local_677);
  pMVar24 = local_658;
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (local_658,opt,(uint32_t)rVar23,&local_518,-1,(this->super_Class).cls,0x420,8,0x28,1,0,
             false);
  local_48 = pMVar24;
  pMVar24 = (MthdD3D56TlvUv *)operator_new(0x25960);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_538,"tlv_v_1",&local_678);
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (pMVar24,opt,(uint32_t)rVar23,&local_538,-1,(this->super_Class).cls,0x424,8,0x28,1,1,
             true);
  local_40 = pMVar24;
  this_01 = (UntestedMthd *)operator_new(0x25950);
  rVar23 = std::
           mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
           ::operator()(this_00);
  std::__cxx11::string::string((string *)&local_558,"draw",&local_679);
  UntestedMthd::SingleMthdTest
            (this_01,opt,(uint32_t)rVar23,&local_558,-1,(this->super_Class).cls,0x540,0x30,4);
  pvVar22 = local_560;
  __l._M_len = 0x21;
  __l._M_array = &local_138;
  local_38 = this_01;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_560,__l,&local_67a);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  return pvVar22;
}

Assistant:

std::vector<SingleMthdTest *> D3D6::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdDmaNotify(opt, rnd(), "dma_notify", -1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_a", -1, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_b", -1, cls, 0x188, 1, DMA_R | DMA_ALIGN),
		new MthdCtxSurf3D(opt, rnd(), "ctx_surf3d", -1, cls, 0x18c, SURF2D_NV4),
		new MthdD3D56TexOffset(opt, rnd(), "tex_0_offset", -1, cls, 0x308, 1),
		new MthdD3D56TexOffset(opt, rnd(), "tex_1_offset", -1, cls, 0x30c, 2),
		new MthdD3D56TexFormat(opt, rnd(), "tex_0_format", -1, cls, 0x310, 1),
		new MthdD3D56TexFormat(opt, rnd(), "tex_1_format", -1, cls, 0x314, 2),
		new MthdD3D56TexFilter(opt, rnd(), "tex_0_filter", -1, cls, 0x318, 1),
		new MthdD3D56TexFilter(opt, rnd(), "tex_1_filter", -1, cls, 0x31c, 2),
		new MthdD3D6CombineControl(opt, rnd(), "combine_0_control_alpha", -1, cls, 0x320, 0, 0),
		new MthdD3D6CombineControl(opt, rnd(), "combine_0_control_color", -1, cls, 0x324, 0, 1),
		new MthdD3D6CombineControl(opt, rnd(), "combine_1_control_alpha", -1, cls, 0x32c, 1, 0),
		new MthdD3D6CombineControl(opt, rnd(), "combine_1_control_color", -1, cls, 0x330, 1, 1),
		new MthdD3D6CombineFactor(opt, rnd(), "combine_factor", -1, cls, 0x334),
		new MthdD3D56Blend(opt, rnd(), "blend", -1, cls, 0x338),
		new MthdD3D56Config(opt, rnd(), "config", -1, cls, 0x33c),
		new MthdD3D6StencilFunc(opt, rnd(), "stencil_func", -1, cls, 0x340),
		new MthdD3D6StencilOp(opt, rnd(), "stencil_op", -1, cls, 0x344),
		new MthdD3D56FogColor(opt, rnd(), "fog_color", -1, cls, 0x348),
		new MthdD3D56TlvX(opt, rnd(), "tlv_x", -1, cls, 0x400, 8, 0x28),
		new MthdD3D56TlvY(opt, rnd(), "tlv_y", -1, cls, 0x404, 8, 0x28),
		new MthdD3D56TlvZ(opt, rnd(), "tlv_z", -1, cls, 0x408, 8, 0x28),
		new MthdD3D56TlvRhw(opt, rnd(), "tlv_rhw", -1, cls, 0x40c, 8, 0x28),
		new MthdD3D56TlvColor(opt, rnd(), "tlv_color", -1, cls, 0x410, 8, 0x28),
		new MthdD3D56TlvFogCol1(opt, rnd(), "tlv_fog_col1", -1, cls, 0x414, 8, 0x28),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_u_0", -1, cls, 0x418, 8, 0x28, 0, 0, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_v_0", -1, cls, 0x41c, 8, 0x28, 0, 1, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_u_1", -1, cls, 0x420, 8, 0x28, 1, 0, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_v_1", -1, cls, 0x424, 8, 0x28, 1, 1, true),
		new UntestedMthd(opt, rnd(), "draw", -1, cls, 0x540, 0x30),
	};
}